

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O2

uint gf_div(uint a,uint b)

{
  int iVar1;
  int iVar2;
  
  if (a == 0) {
    return 0;
  }
  if (b != 0) {
    iVar1 = index_of[a] - index_of[b];
    iVar2 = iVar1 + 0xff;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    return alpha_of[iVar2];
  }
  return 0xffffffff;
}

Assistant:

uint32_t gf_div(uint32_t a, uint32_t b)
{
    int32_t diff;
    if (a == 0)
        return 0; // немного оптимизации не повредит
    if (b == 0)
        return -1;                    // на ноль делить нельзя!
    diff = index_of[a] - index_of[b]; // вычисляем разность индексов
    if (diff < 0)
        diff += GFsize - 1; // приводим разность к модулю GF
    return alpha_of[diff];  // переводим результат в полиномиальную...
                            // ...форму и возвращаем результат
}